

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple16.h
# Opt level: O2

void FastPForLib::Simple16<true>::unpack10_1_9_2(uint32_t **out,uint32_t **in)

{
  uint *puVar1;
  uint *puVar2;
  
  puVar1 = *in;
  puVar2 = *out;
  *puVar2 = *puVar1 >> 0x12 & 0x3ff;
  puVar2[1] = *puVar1 >> 9 & 0x1ff;
  puVar2[2] = *puVar1 & 0x1ff;
  *in = puVar1 + 1;
  *out = puVar2 + 3;
  return;
}

Assistant:

void Simple16<MarkLength>::unpack10_1_9_2(uint32_t **out, const uint32_t **in) {
  uint32_t *pout;
  const uint32_t *pin;

  pout = *out;
  pin = *in;

  pout[0] = (pin[0] >> 18) & 0x03ff;

  pout[1] = (pin[0] >> 9) & 0x01ff;
  pout[2] = pin[0] & 0x01ff;

  *in = pin + 1;
  *out = pout + 3;
}